

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_set_frame_enter(void *addr,int flags,int state)

{
  int iVar1;
  
  iVar1 = __ompt_set_frame_enter_internal(addr,flags,state);
  return iVar1;
}

Assistant:

static int ompt_set_frame_enter(void *addr, int flags, int state) {
 return __ompt_set_frame_enter_internal(addr, flags, state);
}